

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixMainParameters.cpp
# Opt level: O0

void fixMainParameters(Module *module,Program *program)

{
  StringRef RHS;
  StringRef LHS;
  bool bVar1;
  Type *pTVar2;
  size_type sVar3;
  reference ppVVar4;
  pointer pIVar5;
  size_t in_RSI;
  undefined1 auVar6 [16];
  Func *myFunc;
  Function *func;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __end1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __begin1;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *__range1;
  Type *uchar_ptr_ptr;
  string *in_stack_fffffffffffffee8;
  value_type in_stack_fffffffffffffef0;
  allocator *in_stack_fffffffffffffef8;
  Program *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  value_type in_stack_ffffffffffffff10;
  Program *in_stack_ffffffffffffff18;
  allocator local_c9;
  string local_c8 [40];
  Type *in_stack_ffffffffffffff60;
  TypeHandler *in_stack_ffffffffffffff68;
  Func *local_70;
  undefined1 local_58 [16];
  reference local_48;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_40;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_38;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  local_30;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *local_20;
  Type *local_18;
  
  std::unique_ptr<CharType,_std::default_delete<CharType>_>::get
            ((unique_ptr<CharType,_std::default_delete<CharType>_> *)in_stack_fffffffffffffef0);
  TypeHandler::pointerTo(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  local_18 = TypeHandler::pointerTo(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  local_30 = llvm::Module::functions((Module *)in_stack_ffffffffffffff00);
  local_20 = &local_30;
  local_38 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::begin(local_20);
  local_40 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::end(local_20);
  while( true ) {
    bVar1 = llvm::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    local_48 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                            *)0x290c79);
    auVar6 = llvm::Value::getName();
    local_58 = auVar6;
    llvm::StringRef::StringRef
              ((StringRef *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    LHS.Length = in_RSI;
    LHS.Data = (char *)in_stack_ffffffffffffff18;
    RHS.Length = (size_t)in_stack_ffffffffffffff10;
    RHS.Data = in_stack_ffffffffffffff08;
    bVar1 = llvm::operator!=(LHS,RHS);
    if (!bVar1) {
      local_70 = Program::getFunction
                           (in_stack_ffffffffffffff18,(Function *)in_stack_ffffffffffffff10);
      llvm::Function::getReturnType((Function *)0x290d0c);
      bVar1 = llvm::Type::isIntegerTy((Type *)0x290d14);
      if (bVar1) {
        pTVar2 = (Type *)std::unique_ptr<IntType,_std::default_delete<IntType>_>::get
                                   ((unique_ptr<IntType,_std::default_delete<IntType>_> *)
                                    in_stack_fffffffffffffef0);
        local_70->returnType = pTVar2;
      }
      sVar3 = std::vector<Value_*,_std::allocator<Value_*>_>::size(&local_70->parameters);
      if (sVar3 != 0) {
        in_stack_ffffffffffffff08 = (char *)0x0;
        ppVVar4 = std::vector<Value_*,_std::allocator<Value_*>_>::operator[]
                            (&local_70->parameters,0);
        in_stack_ffffffffffffff00 = (Program *)*ppVVar4;
        pIVar5 = std::unique_ptr<IntType,_std::default_delete<IntType>_>::get
                           ((unique_ptr<IntType,_std::default_delete<IntType>_> *)
                            in_stack_fffffffffffffef0);
        (*((Expr *)&(in_stack_ffffffffffffff00->typeHandler).program)->_vptr_Expr[5])
                  (in_stack_ffffffffffffff00,pIVar5);
        ppVVar4 = std::vector<Value_*,_std::allocator<Value_*>_>::operator[]
                            (&local_70->parameters,(size_type)in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff10 = *ppVVar4;
        in_stack_ffffffffffffff18 = (Program *)&stack0xffffffffffffff6f;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff70,"argc",(allocator *)in_stack_ffffffffffffff18)
        ;
        Value::setName(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
      }
      sVar3 = std::vector<Value_*,_std::allocator<Value_*>_>::size(&local_70->parameters);
      if (1 < sVar3) {
        in_stack_fffffffffffffee8 = (string *)0x1;
        ppVVar4 = std::vector<Value_*,_std::allocator<Value_*>_>::operator[]
                            (&local_70->parameters,1);
        (*((*ppVVar4)->super_ExprBase).super_Expr._vptr_Expr[5])(*ppVVar4,local_18);
        ppVVar4 = std::vector<Value_*,_std::allocator<Value_*>_>::operator[]
                            (&local_70->parameters,(size_type)in_stack_fffffffffffffee8);
        in_stack_fffffffffffffef0 = *ppVVar4;
        in_stack_fffffffffffffef8 = &local_c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c8,"argv",in_stack_fffffffffffffef8);
        Value::setName(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      }
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)in_stack_fffffffffffffef0);
  }
  Program::addPass(in_stack_ffffffffffffff00,(PassType)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  return;
}

Assistant:

void fixMainParameters(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateFunctionParameters));

    auto* uchar_ptr_ptr = program.typeHandler.pointerTo(program.typeHandler.pointerTo(program.typeHandler.schar.get()));

    for (const llvm::Function& func : module->functions()) {
        if (func.getName() != "main") {
            continue;
        }

        auto* myFunc = program.getFunction(&func);

        if (func.getReturnType()->isIntegerTy())
            myFunc->returnType = program.typeHandler.sint.get();

        if (myFunc->parameters.size() >= 1) {
            myFunc->parameters[0]->setType(program.typeHandler.sint.get());
            myFunc->parameters[0]->setName("argc");
        }

        if (myFunc->parameters.size() >= 2) {
            myFunc->parameters[1]->setType(uchar_ptr_ptr);
            myFunc->parameters[1]->setName("argv");
        }

    }

    program.addPass(PassType::FixMainParameters);
}